

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

long * __thiscall
google::protobuf::RepeatedField<long>::elements(RepeatedField<long> *this,bool is_soo)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  void *ptr;
  RepeatedField<long> *this_00;
  Arena *pAVar4;
  undefined7 in_register_00000031;
  undefined1 *puVar5;
  SooRep *this_01;
  Arena *this_02;
  SooRep *unaff_R14;
  Arena *pAStack_58;
  Arena *pAStack_50;
  SooRep *pSStack_48;
  undefined1 local_10 [16];
  
  uVar1 = 1;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    uVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (0 < (int)uVar1) {
    if (is_soo) {
      return (long *)((long)&(this->soo_rep_).field_0 + 8);
    }
    plVar3 = (long *)internal::LongSooRep::elements((LongSooRep *)this);
    return plVar3;
  }
  puVar5 = local_10;
  this_01 = (SooRep *)(ulong)uVar1;
  elements();
  pAVar4 = (Arena *)((ulong)puVar5 & 0xffffffff);
  if ((int)puVar5 < 0) {
    pSStack_48 = (SooRep *)0x14503a;
    Mutable();
  }
  else {
    pSStack_48 = (SooRep *)0x14500a;
    iVar2 = internal::SooRep::size
                      (this_01,(undefined1  [16])
                               ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    unaff_R14 = this_01;
    if ((int)puVar5 < iVar2) {
      pSStack_48 = (SooRep *)0x145020;
      plVar3 = elements((RepeatedField<long> *)this_01,
                        (undefined1  [16])
                        ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
      return plVar3 + (long)pAVar4;
    }
  }
  pSStack_48 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>;
  this_02 = pAVar4;
  Mutable();
  pAStack_50 = pAVar4;
  pSStack_48 = unaff_R14;
  if (this_02 == (Arena *)0x0) {
    this_00 = (RepeatedField<long> *)operator_new(0x10);
    RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_02,0x10);
    pAStack_58 = this_02;
    this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
              Construct<google::protobuf::Arena*>(ptr,&pAStack_58);
  }
  return (long *)this_00;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }